

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsdfs_test.cpp
# Opt level: O3

Float AdaptiveSimpson(function<float_(float)> *f,Float x0,Float x1,Float eps,int depth)

{
  undefined1 auVar1 [16];
  float fVar2;
  int count;
  Float local_5c;
  Float local_58;
  float local_54;
  float local_50;
  float local_4c;
  Float local_48;
  undefined4 local_44;
  _Any_data local_40;
  code *local_30;
  code *local_28;
  
  local_44 = 0;
  local_40._8_8_ = 0;
  local_58 = x1;
  local_48 = eps;
  local_40._M_unused._M_object = operator_new(0x18);
  *(function<float_(float)> **)local_40._M_unused._0_8_ = f;
  *(undefined4 **)((long)local_40._M_unused._0_8_ + 8) = &local_44;
  *(_Any_data **)((long)local_40._M_unused._0_8_ + 0x10) = &local_40;
  local_28 = std::
             _Function_handler<float_(float,_float,_float,_float,_float,_float,_float,_float,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bsdfs_test.cpp:146:21)>
             ::_M_invoke;
  local_30 = std::
             _Function_handler<float_(float,_float,_float,_float,_float,_float,_float,_float,_int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/bsdfs_test.cpp:146:21)>
             ::_M_manager;
  local_5c = x0;
  if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
    std::__throw_bad_function_call();
  }
  local_4c = (*f->_M_invoker)((_Any_data *)f,&local_5c);
  local_5c = (x0 + local_58) * 0.5;
  local_50 = local_5c;
  if ((f->super__Function_base)._M_manager != (_Manager_type)0x0) {
    local_54 = (*f->_M_invoker)((_Any_data *)f,&local_5c);
    local_5c = local_58;
    if ((f->super__Function_base)._M_manager != (_Manager_type)0x0) {
      fVar2 = (*f->_M_invoker)((_Any_data *)f,&local_5c);
      auVar1 = vfmadd231ss_fma(ZEXT416((uint)local_4c),ZEXT416((uint)local_54),ZEXT416(0x40800000));
      fVar2 = std::function<float_(float,_float,_float,_float,_float,_float,_float,_float,_int)>::
              operator()((function<float_(float,_float,_float,_float,_float,_float,_float,_float,_int)>
                          *)&local_40,x0,local_50,local_58,local_4c,local_54,fVar2,
                         (local_58 - x0) * 0.16666667 * (auVar1._0_4_ + fVar2),local_48,depth);
      if (local_30 != (code *)0x0) {
        (*local_30)(&local_40,&local_40,__destroy_functor);
      }
      return fVar2;
    }
    std::__throw_bad_function_call();
  }
  std::__throw_bad_function_call();
}

Assistant:

Float AdaptiveSimpson(const std::function<Float(Float)>& f, Float x0, Float x1,
                      Float eps = 1e-6f, int depth = 6) {
    int count = 0;
    /* Define an recursive lambda function for integration over subintervals */
    std::function<Float(Float, Float, Float, Float, Float, Float, Float, Float, int)>
        integrate = [&](Float a, Float b, Float c, Float fa, Float fb, Float fc, Float I,
                        Float eps, int depth) {
            /* Evaluate the function at two intermediate points */
            Float d = 0.5f * (a + b), e = 0.5f * (b + c), fd = f(d), fe = f(e);

            /* Simpson integration over each subinterval */
            Float h = c - a, I0 = (Float)(1.0 / 12.0) * h * (fa + 4 * fd + fb),
                  I1 = (Float)(1.0 / 12.0) * h * (fb + 4 * fe + fc), Ip = I0 + I1;
            ++count;

            /* Stopping criterion from J.N. Lyness (1969)
              "Notes on the adaptive Simpson quadrature routine" */
            if (depth <= 0 || std::abs(Ip - I) < 15 * eps) {
                // Richardson extrapolation
                return Ip + (Float)(1.0 / 15.0) * (Ip - I);
            }

            return integrate(a, d, b, fa, fd, fb, I0, .5f * eps, depth - 1) +
                   integrate(b, e, c, fb, fe, fc, I1, .5f * eps, depth - 1);
        };
    Float a = x0, b = 0.5f * (x0 + x1), c = x1;
    Float fa = f(a), fb = f(b), fc = f(c);
    Float I = (c - a) * (Float)(1.0 / 6.0) * (fa + 4 * fb + fc);
    return integrate(a, b, c, fa, fb, fc, I, eps, depth);
}